

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerFunctionBodyCallCountChange(Lowerer *this,Instr *insertBeforeInstr)

{
  Func *this_00;
  code *pcVar1;
  undefined8 instr;
  bool bVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  StackSym *sym;
  RegOpnd *pRVar5;
  Var address;
  AddrOpnd *src;
  IndirOpnd *opnd;
  Instr *this_01;
  HelperCallOpnd *newSrc;
  IntConstOpnd *src2;
  undefined1 local_68 [8];
  AutoReuseOpnd autoReuseCountAddressOpnd;
  AutoReuseOpnd autoReuseCountOpnd;
  Instr *onOverflowInsertBeforeInstr;
  
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x684c,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = insertBeforeInstr->m_func;
  bVar2 = Func::IsSimpleJit(this_00);
  if (bVar2) {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FullJitPhase,sourceContextId,functionId);
    if (bVar3) {
      return;
    }
  }
  sym = StackSym::New(TyUint64,this_00);
  pRVar5 = IR::RegOpnd::New(sym,TyUint64,this_00);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_68,&pRVar5->super_Opnd,this_00,true);
  address = (Var)JITTimeWorkItem::GetCallsCountAddress(this_00->m_workItem);
  src = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this_00,true,(Var)0x0);
  InsertMove(&pRVar5->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  opnd = IR::IndirOpnd::New(pRVar5,0,TyUint32,this_00,false);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseCountAddressOpnd.autoDelete,&opnd->super_Opnd,this_00,true);
  if (bVar2) {
    InsertDecUInt32PreventOverflow
              (&opnd->super_Opnd,&opnd->super_Opnd,insertBeforeInstr,
               (Instr **)&autoReuseCountOpnd.autoDelete);
    instr = autoReuseCountOpnd._16_8_;
    pRVar5 = IR::Opnd::CreateFramePointerOpnd(this_00);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)instr,&pRVar5->super_Opnd);
    this_01 = IR::Instr::New(Call,this_00);
    newSrc = IR::HelperCallOpnd::New(HelperTransitionFromSimpleJit,this_00);
    IR::Instr::SetSrc1(this_01,&newSrc->super_Opnd);
    IR::Instr::InsertBefore((Instr *)autoReuseCountOpnd._16_8_,this_01);
    LowererMD::LowerCall(&this->m_lowererMD,this_01,0);
  }
  else {
    src2 = IR::IntConstOpnd::New(1,TyUint32,this_00,false);
    InsertAdd(false,&opnd->super_Opnd,&opnd->super_Opnd,&src2->super_Opnd,insertBeforeInstr);
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseCountAddressOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_68);
  return;
}

Assistant:

void Lowerer::LowerFunctionBodyCallCountChange(IR::Instr *const insertBeforeInstr)
{
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;
    const bool isSimpleJit = func->IsSimpleJit();

    if ((isSimpleJit && PHASE_OFF(Js::FullJitPhase, m_func)))
    {
        return;
    }

    // mov countAddress, <countAddress>
    IR::RegOpnd *const countAddressOpnd = IR::RegOpnd::New(StackSym::New(TyMachPtr, func), TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseCountAddressOpnd(countAddressOpnd, func);
    InsertMove(
        countAddressOpnd,
        IR::AddrOpnd::New((Js::Var)func->GetWorkItem()->GetCallsCountAddress(), IR::AddrOpndKindDynamicMisc, func, true),
        insertBeforeInstr);

    IR::IndirOpnd *const countOpnd = IR::IndirOpnd::New(countAddressOpnd, 0, TyUint32, func);
    const IR::AutoReuseOpnd autoReuseCountOpnd(countOpnd, func);
    if(!isSimpleJit)
    {
        InsertAdd(false, countOpnd, countOpnd, IR::IntConstOpnd::New(1, TyUint32, func), insertBeforeInstr);
        return;
    }

    IR::Instr *onOverflowInsertBeforeInstr;
    InsertDecUInt32PreventOverflow(
        countOpnd,
        countOpnd,
        insertBeforeInstr,
        &onOverflowInsertBeforeInstr);

    //   ($overflow:)
    //     TransitionFromSimpleJit(framePointer)
    m_lowererMD.LoadHelperArgument(onOverflowInsertBeforeInstr, IR::Opnd::CreateFramePointerOpnd(func));
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperTransitionFromSimpleJit, func));
    onOverflowInsertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.LowerCall(callInstr, 0);
}